

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autocompact_test.cc
# Opt level: O2

void __thiscall leveldb::AutoCompactTest::~AutoCompactTest(AutoCompactTest *this)

{
  Status SStack_88;
  Options local_80;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__AutoCompactTest_0016b468;
  if (this->db_ != (DB *)0x0) {
    (*this->db_->_vptr_DB[1])();
  }
  Options::Options(&local_80);
  DestroyDB((leveldb *)&SStack_88,&this->dbname_,&local_80);
  Status::~Status(&SStack_88);
  if (this->tiny_cache_ != (Cache *)0x0) {
    (*this->tiny_cache_->_vptr_Cache[1])();
  }
  std::__cxx11::string::_M_dispose();
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

~AutoCompactTest() {
    delete db_;
    DestroyDB(dbname_, Options());
    delete tiny_cache_;
  }